

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::InitializeFromParent(cmStateSnapshot *this)

{
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  ReferenceType this_00;
  PointerType pBVar3;
  PointerType pBVar4;
  PositionType *this_01;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  cmValue local_90;
  cmValue include_regex;
  cmDefinitions local_58;
  undefined1 local_20 [8];
  PositionType parent;
  cmStateSnapshot *this_local;
  
  parent.Position = (PositionType)this;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  local_20 = (undefined1  [8])(pSVar2->DirectoryParent).Tree;
  parent.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(pSVar2->DirectoryParent).Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (!bVar1) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x16a,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (!bVar1) {
    __assert_fail("parent->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x16b,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  begin.Tree = (pSVar2->Vars).Tree;
  begin.Position = (pSVar2->Vars).Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  end.Tree = (pSVar2->Root).Tree;
  end.Position = (pSVar2->Root).Position;
  cmDefinitions::MakeClosure(&local_58,begin,end);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  this_00 = cmLinkedTree<cmDefinitions>::iterator::operator*(&pSVar2->Vars);
  cmDefinitions::operator=(this_00,&local_58);
  cmDefinitions::~cmDefinitions(&local_58);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  this_01 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
            (&pBVar3->IncludeDirectories,&pBVar4->IncludeDirectories,
             &pSVar2->IncludeDirectoryPosition);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
            (&pBVar3->CompileDefinitions,&pBVar4->CompileDefinitions,
             &pSVar2->CompileDefinitionsPosition);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
            (&pBVar3->CompileOptions,&pBVar4->CompileOptions,&pSVar2->CompileOptionsPosition);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
            (&pBVar3->LinkOptions,&pBVar4->LinkOptions,&pSVar2->LinkOptionsPosition);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
            (&pBVar3->LinkDirectories,&pBVar4->LinkDirectories,&pSVar2->LinkDirectoriesPosition);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"INCLUDE_REGULAR_EXPRESSION",&local_b1);
  local_90 = cmPropertyMap::GetPropertyValue(&pBVar3->Properties,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"INCLUDE_REGULAR_EXPRESSION",&local_d9);
  cmPropertyMap::SetProperty(&pBVar3->Properties,&local_d8,local_90);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent()
{
  cmStateDetail::PositionType parent = this->Position->DirectoryParent;
  assert(this->Position->Vars.IsValid());
  assert(parent->Vars.IsValid());

  *this->Position->Vars =
    cmDefinitions::MakeClosure(parent->Vars, parent->Root);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->IncludeDirectories,
    this->Position->BuildSystemDirectory->IncludeDirectories,
    this->Position->IncludeDirectoryPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileDefinitions,
    this->Position->BuildSystemDirectory->CompileDefinitions,
    this->Position->CompileDefinitionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileOptions,
    this->Position->BuildSystemDirectory->CompileOptions,
    this->Position->CompileOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkOptions,
    this->Position->BuildSystemDirectory->LinkOptions,
    this->Position->LinkOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkDirectories,
    this->Position->BuildSystemDirectory->LinkDirectories,
    this->Position->LinkDirectoriesPosition);

  cmValue include_regex =
    parent->BuildSystemDirectory->Properties.GetPropertyValue(
      "INCLUDE_REGULAR_EXPRESSION");
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", include_regex);
}